

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_dataset_metadata.cpp
# Opt level: O2

void __thiscall
dlib::image_dataset_metadata::doc_handler::start_element
          (doc_handler *this,unsigned_long line_number,string *name,attribute_list *atts)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>_>_>_>
  *this_00;
  bool bVar1;
  int iVar2;
  gender_t gVar3;
  undefined4 extraout_var;
  long lVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  ostream *poVar5;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  long lVar6;
  undefined4 extraout_var_12;
  size_type sVar7;
  undefined4 extraout_var_13;
  mapped_type *pmVar8;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  error *peVar9;
  double dVar10;
  undefined1 auVar11 [16];
  string sStack_218;
  ostringstream sout;
  unsigned_long line_number_local;
  string local_70 [32];
  allocator local_50 [32];
  
  if ((this->ts).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->ts).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar1 = std::operator!=(name,"dataset");
    if (bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&sout);
      poVar5 = std::operator<<((ostream *)&sout,
                               "Invalid XML document.  Root tag must be <dataset>.  Found <");
      poVar5 = std::operator<<(poVar5,(string *)name);
      std::operator<<(poVar5,"> instead.");
      peVar9 = (error *)__cxa_allocate_exception(0x30);
      std::__cxx11::stringbuf::str();
      error::error(peVar9,&sStack_218);
      __cxa_throw(peVar9,&error::typeinfo,error::~error);
    }
  }
  else {
    bVar1 = std::operator==(name,"box");
    if (bVar1) {
      std::__cxx11::string::string((string *)&sout,"top",(allocator *)&sStack_218);
      iVar2 = (*(atts->
                super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_enumerable[9])(atts,&sout);
      std::__cxx11::string::~string((string *)&sout);
      if ((char)iVar2 == '\0') {
        peVar9 = (error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&sout,"<box> missing required attribute \'top\'",
                   (allocator *)&sStack_218);
        error::error(peVar9,(string *)&sout);
        __cxa_throw(peVar9,&error::typeinfo,error::~error);
      }
      std::__cxx11::string::string((string *)&sout,"top",(allocator *)&sStack_218);
      iVar2 = (*(atts->
                super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_enumerable[10])(atts,&sout);
      lVar4 = string_cast_helper<long>::cast<char,std::char_traits<char>,std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(extraout_var,iVar2));
      (this->temp_box).rect.t = lVar4;
      std::__cxx11::string::~string((string *)&sout);
      std::__cxx11::string::string((string *)&sout,"left",(allocator *)&sStack_218);
      iVar2 = (*(atts->
                super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_enumerable[9])(atts,&sout);
      std::__cxx11::string::~string((string *)&sout);
      if ((char)iVar2 == '\0') {
        peVar9 = (error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&sout,"<box> missing required attribute \'left\'",
                   (allocator *)&sStack_218);
        error::error(peVar9,(string *)&sout);
        __cxa_throw(peVar9,&error::typeinfo,error::~error);
      }
      std::__cxx11::string::string((string *)&sout,"left",(allocator *)&sStack_218);
      iVar2 = (*(atts->
                super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_enumerable[10])(atts,&sout);
      lVar4 = string_cast_helper<long>::cast<char,std::char_traits<char>,std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(extraout_var_00,iVar2));
      (this->temp_box).rect.l = lVar4;
      std::__cxx11::string::~string((string *)&sout);
      std::__cxx11::string::string((string *)&sout,"width",(allocator *)&sStack_218);
      iVar2 = (*(atts->
                super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_enumerable[9])(atts,&sout);
      std::__cxx11::string::~string((string *)&sout);
      if ((char)iVar2 == '\0') {
        peVar9 = (error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&sout,"<box> missing required attribute \'width\'",
                   (allocator *)&sStack_218);
        error::error(peVar9,(string *)&sout);
        __cxa_throw(peVar9,&error::typeinfo,error::~error);
      }
      std::__cxx11::string::string((string *)&sout,"width",(allocator *)&sStack_218);
      iVar2 = (*(atts->
                super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_enumerable[10])(atts,&sout);
      lVar4 = string_cast_helper<long>::cast<char,std::char_traits<char>,std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(extraout_var_01,iVar2));
      (this->temp_box).rect.r = lVar4;
      std::__cxx11::string::~string((string *)&sout);
      std::__cxx11::string::string((string *)&sout,"height",(allocator *)&sStack_218);
      iVar2 = (*(atts->
                super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_enumerable[9])(atts,&sout);
      std::__cxx11::string::~string((string *)&sout);
      if ((char)iVar2 == '\0') {
        peVar9 = (error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&sout,"<box> missing required attribute \'height\'",
                   (allocator *)&sStack_218);
        error::error(peVar9,(string *)&sout);
        __cxa_throw(peVar9,&error::typeinfo,error::~error);
      }
      std::__cxx11::string::string((string *)&sout,"height",(allocator *)&sStack_218);
      iVar2 = (*(atts->
                super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_enumerable[10])(atts,&sout);
      lVar4 = string_cast_helper<long>::cast<char,std::char_traits<char>,std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(extraout_var_02,iVar2));
      (this->temp_box).rect.b = lVar4;
      std::__cxx11::string::~string((string *)&sout);
      std::__cxx11::string::string((string *)&sout,"difficult",(allocator *)&sStack_218);
      iVar2 = (*(atts->
                super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_enumerable[9])(atts,&sout);
      std::__cxx11::string::~string((string *)&sout);
      if ((char)iVar2 != '\0') {
        std::__cxx11::string::string((string *)&sout,"difficult",(allocator *)&sStack_218);
        iVar2 = (*(atts->
                  super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._vptr_enumerable[10])(atts,&sout);
        bVar1 = string_cast_helper<bool>::cast<char,std::char_traits<char>,std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var_03,iVar2));
        (this->temp_box).difficult = bVar1;
        std::__cxx11::string::~string((string *)&sout);
      }
      std::__cxx11::string::string((string *)&sout,"truncated",(allocator *)&sStack_218);
      iVar2 = (*(atts->
                super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_enumerable[9])(atts,&sout);
      std::__cxx11::string::~string((string *)&sout);
      if ((char)iVar2 != '\0') {
        std::__cxx11::string::string((string *)&sout,"truncated",(allocator *)&sStack_218);
        iVar2 = (*(atts->
                  super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._vptr_enumerable[10])(atts,&sout);
        bVar1 = string_cast_helper<bool>::cast<char,std::char_traits<char>,std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var_04,iVar2));
        (this->temp_box).truncated = bVar1;
        std::__cxx11::string::~string((string *)&sout);
      }
      std::__cxx11::string::string((string *)&sout,"occluded",(allocator *)&sStack_218);
      iVar2 = (*(atts->
                super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_enumerable[9])(atts,&sout);
      std::__cxx11::string::~string((string *)&sout);
      if ((char)iVar2 != '\0') {
        std::__cxx11::string::string((string *)&sout,"occluded",(allocator *)&sStack_218);
        iVar2 = (*(atts->
                  super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._vptr_enumerable[10])(atts,&sout);
        bVar1 = string_cast_helper<bool>::cast<char,std::char_traits<char>,std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var_05,iVar2));
        (this->temp_box).occluded = bVar1;
        std::__cxx11::string::~string((string *)&sout);
      }
      std::__cxx11::string::string((string *)&sout,"ignore",(allocator *)&sStack_218);
      iVar2 = (*(atts->
                super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_enumerable[9])(atts,&sout);
      std::__cxx11::string::~string((string *)&sout);
      if ((char)iVar2 != '\0') {
        std::__cxx11::string::string((string *)&sout,"ignore",(allocator *)&sStack_218);
        iVar2 = (*(atts->
                  super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._vptr_enumerable[10])(atts,&sout);
        bVar1 = string_cast_helper<bool>::cast<char,std::char_traits<char>,std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var_06,iVar2));
        (this->temp_box).ignore = bVar1;
        std::__cxx11::string::~string((string *)&sout);
      }
      std::__cxx11::string::string((string *)&sout,"angle",(allocator *)&sStack_218);
      iVar2 = (*(atts->
                super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_enumerable[9])(atts,&sout);
      std::__cxx11::string::~string((string *)&sout);
      if ((char)iVar2 != '\0') {
        std::__cxx11::string::string((string *)&sout,"angle",(allocator *)&sStack_218);
        iVar2 = (*(atts->
                  super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._vptr_enumerable[10])(atts,&sout);
        dVar10 = string_cast_helper<double>::cast<char,std::char_traits<char>,std::allocator<char>>
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(extraout_var_07,iVar2));
        (this->temp_box).angle = dVar10;
        std::__cxx11::string::~string((string *)&sout);
      }
      std::__cxx11::string::string((string *)&sout,"age",(allocator *)&sStack_218);
      iVar2 = (*(atts->
                super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_enumerable[9])(atts,&sout);
      std::__cxx11::string::~string((string *)&sout);
      if ((char)iVar2 != '\0') {
        std::__cxx11::string::string((string *)&sout,"age",(allocator *)&sStack_218);
        iVar2 = (*(atts->
                  super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._vptr_enumerable[10])(atts,&sout);
        dVar10 = string_cast_helper<double>::cast<char,std::char_traits<char>,std::allocator<char>>
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(extraout_var_08,iVar2));
        (this->temp_box).age = dVar10;
        std::__cxx11::string::~string((string *)&sout);
      }
      std::__cxx11::string::string((string *)&sout,"gender",(allocator *)&sStack_218);
      iVar2 = (*(atts->
                super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_enumerable[9])(atts,&sout);
      std::__cxx11::string::~string((string *)&sout);
      if ((char)iVar2 != '\0') {
        std::__cxx11::string::string((string *)&sout,"gender",(allocator *)&sStack_218);
        iVar2 = (*(atts->
                  super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._vptr_enumerable[10])(atts,&sout);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(extraout_var_09,iVar2),"male");
        std::__cxx11::string::~string((string *)&sout);
        if (bVar1) {
          gVar3 = MALE;
        }
        else {
          std::__cxx11::string::string((string *)&sout,"gender",(allocator *)&sStack_218);
          iVar2 = (*(atts->
                    super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._vptr_enumerable[10])(atts,&sout);
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(extraout_var_14,iVar2),"female");
          std::__cxx11::string::~string((string *)&sout);
          if (bVar1) {
            gVar3 = FEMALE;
          }
          else {
            std::__cxx11::string::string((string *)&sout,"gender",(allocator *)&sStack_218);
            iVar2 = (*(atts->
                      super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._vptr_enumerable[10])(atts,&sout);
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(extraout_var_15,iVar2),"unknown");
            std::__cxx11::string::~string((string *)&sout);
            gVar3 = UNKNOWN;
            if (!bVar1) {
              peVar9 = (error *)__cxa_allocate_exception(0x30);
              std::__cxx11::string::string
                        ((string *)&sout,"Invalid gender string in box attribute.",
                         (allocator *)&sStack_218);
              error::error(peVar9,(string *)&sout);
              __cxa_throw(peVar9,&error::typeinfo,error::~error);
            }
          }
        }
        (this->temp_box).gender = gVar3;
      }
      std::__cxx11::string::string((string *)&sout,"pose",(allocator *)&sStack_218);
      iVar2 = (*(atts->
                super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_enumerable[9])(atts,&sout);
      std::__cxx11::string::~string((string *)&sout);
      if ((char)iVar2 != '\0') {
        std::__cxx11::string::string((string *)&sout,"pose",(allocator *)&sStack_218);
        iVar2 = (*(atts->
                  super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._vptr_enumerable[10])(atts,&sout);
        dVar10 = string_cast_helper<double>::cast<char,std::char_traits<char>,std::allocator<char>>
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(extraout_var_16,iVar2));
        (this->temp_box).pose = dVar10;
        std::__cxx11::string::~string((string *)&sout);
      }
      std::__cxx11::string::string((string *)&sout,"detection_score",(allocator *)&sStack_218);
      iVar2 = (*(atts->
                super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._vptr_enumerable[9])(atts,&sout);
      std::__cxx11::string::~string((string *)&sout);
      if ((char)iVar2 != '\0') {
        std::__cxx11::string::string((string *)&sout,"detection_score",(allocator *)&sStack_218);
        iVar2 = (*(atts->
                  super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._vptr_enumerable[10])(atts,&sout);
        dVar10 = string_cast_helper<double>::cast<char,std::char_traits<char>,std::allocator<char>>
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(extraout_var_17,iVar2));
        (this->temp_box).detection_score = dVar10;
        std::__cxx11::string::~string((string *)&sout);
      }
      lVar4 = (this->temp_box).rect.t;
      lVar6 = (this->temp_box).rect.b;
      auVar11._8_4_ = 0xffffffff;
      auVar11._0_8_ = 0xffffffffffffffff;
      auVar11._12_4_ = 0xffffffff;
      (this->temp_box).rect.r = (this->temp_box).rect.r + (this->temp_box).rect.l + -1;
      (this->temp_box).rect.b = auVar11._8_8_ + lVar6 + lVar4;
    }
    else {
      bVar1 = std::operator==(name,"part");
      if ((bVar1) &&
         (bVar1 = std::operator==((this->ts).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + -1,"box"), bVar1)) {
        std::__cxx11::string::string((string *)&sout,"x",(allocator *)&sStack_218);
        iVar2 = (*(atts->
                  super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._vptr_enumerable[9])(atts,&sout);
        std::__cxx11::string::~string((string *)&sout);
        if ((char)iVar2 == '\0') {
          peVar9 = (error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&sout,"<part> missing required attribute \'x\'",
                     (allocator *)&sStack_218);
          error::error(peVar9,(string *)&sout);
          __cxa_throw(peVar9,&error::typeinfo,error::~error);
        }
        std::__cxx11::string::string((string *)&sout,"x",(allocator *)&sStack_218);
        iVar2 = (*(atts->
                  super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._vptr_enumerable[10])(atts,&sout);
        lVar4 = string_cast_helper<long>::cast<char,std::char_traits<char>,std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var_10,iVar2));
        std::__cxx11::string::~string((string *)&sout);
        std::__cxx11::string::string((string *)&sout,"y",(allocator *)&sStack_218);
        iVar2 = (*(atts->
                  super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._vptr_enumerable[9])(atts,&sout);
        std::__cxx11::string::~string((string *)&sout);
        if ((char)iVar2 == '\0') {
          peVar9 = (error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&sout,"<part> missing required attribute \'y\'",
                     (allocator *)&sStack_218);
          error::error(peVar9,(string *)&sout);
          __cxa_throw(peVar9,&error::typeinfo,error::~error);
        }
        std::__cxx11::string::string((string *)&sout,"y",(allocator *)&sStack_218);
        iVar2 = (*(atts->
                  super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._vptr_enumerable[10])(atts,&sout);
        lVar6 = string_cast_helper<long>::cast<char,std::char_traits<char>,std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var_11,iVar2));
        std::__cxx11::string::~string((string *)&sout);
        std::__cxx11::string::string((string *)&sout,"name",(allocator *)&sStack_218);
        iVar2 = (*(atts->
                  super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._vptr_enumerable[9])(atts,&sout);
        std::__cxx11::string::~string((string *)&sout);
        if ((char)iVar2 == '\0') {
          peVar9 = (error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&sout,"<part> missing required attribute \'name\'",
                     (allocator *)&sStack_218);
          error::error(peVar9,(string *)&sout);
          __cxa_throw(peVar9,&error::typeinfo,error::~error);
        }
        std::__cxx11::string::string((string *)&sout,"name",(allocator *)&sStack_218);
        iVar2 = (*(atts->
                  super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._vptr_enumerable[10])(atts,&sout);
        this_00 = &(this->temp_box).parts;
        sVar7 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>_>_>_>
                ::count(this_00,(key_type *)CONCAT44(extraout_var_12,iVar2));
        std::__cxx11::string::~string((string *)&sout);
        if (sVar7 != 0) {
          peVar9 = (error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string(local_70,"name",local_50);
          iVar2 = (*(atts->
                    super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._vptr_enumerable[10])(atts,local_70);
          std::operator+(&sStack_218,"<part> with name \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(extraout_var_18,iVar2));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sout,
                         &sStack_218,"\' is defined more than one time in a single box.");
          error::error(peVar9,(string *)&sout);
          __cxa_throw(peVar9,&error::typeinfo,error::~error);
        }
        std::__cxx11::string::string((string *)&sout,"name",(allocator *)&sStack_218);
        iVar2 = (*(atts->
                  super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._vptr_enumerable[10])(atts,&sout);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::vector<long,_2L>_>_>_>
                 ::operator[](this_00,(key_type *)CONCAT44(extraout_var_13,iVar2));
        (pmVar8->
        super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
        ).data.data[0] = lVar4;
        (pmVar8->
        super_matrix<long,_2L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
        ).data.data[1] = lVar6;
      }
      else {
        bVar1 = std::operator==(name,"image");
        if (!bVar1) goto LAB_0023361f;
        std::
        vector<dlib::image_dataset_metadata::box,_std::allocator<dlib::image_dataset_metadata::box>_>
        ::clear(&(this->temp_image).boxes);
        std::__cxx11::string::string((string *)&sout,"file",(allocator *)&sStack_218);
        iVar2 = (*(atts->
                  super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._vptr_enumerable[9])(atts,&sout);
        std::__cxx11::string::~string((string *)&sout);
        if ((char)iVar2 == '\0') {
          peVar9 = (error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&sout,"<image> missing required attribute \'file\'",
                     (allocator *)&sStack_218);
          error::error(peVar9,(string *)&sout);
          __cxa_throw(peVar9,&error::typeinfo,error::~error);
        }
        std::__cxx11::string::string((string *)&sout,"file",(allocator *)&sStack_218);
        (*(atts->
          super_enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._vptr_enumerable[10])(atts,&sout);
        std::__cxx11::string::_M_assign((string *)&this->temp_image);
      }
      std::__cxx11::string::~string((string *)&sout);
    }
  }
LAB_0023361f:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->ts,name);
  return;
}

Assistant:

virtual void start_element ( 
                const unsigned long line_number,
                const std::string& name,
                const dlib::attribute_list& atts
            )
            {
                try
                {
                    if (ts.size() == 0) 
                    {
                        if (name != "dataset")
                        {
                            std::ostringstream sout;
                            sout << "Invalid XML document.  Root tag must be <dataset>.  Found <" << name << "> instead.";
                            throw dlib::error(sout.str());
                        }
                        else
                        {
                            ts.push_back(name);
                            return;
                        }
                    }


                    if (name == "box")
                    {
                        if (atts.is_in_list("top")) temp_box.rect.top() = sa = atts["top"];
                        else throw dlib::error("<box> missing required attribute 'top'");

                        if (atts.is_in_list("left")) temp_box.rect.left() = sa = atts["left"];
                        else throw dlib::error("<box> missing required attribute 'left'");

                        if (atts.is_in_list("width")) temp_box.rect.right() = sa = atts["width"];
                        else throw dlib::error("<box> missing required attribute 'width'");

                        if (atts.is_in_list("height")) temp_box.rect.bottom() = sa = atts["height"];
                        else throw dlib::error("<box> missing required attribute 'height'");

                        if (atts.is_in_list("difficult")) temp_box.difficult = sa = atts["difficult"];
                        if (atts.is_in_list("truncated")) temp_box.truncated = sa = atts["truncated"];
                        if (atts.is_in_list("occluded"))  temp_box.occluded  = sa = atts["occluded"];
                        if (atts.is_in_list("ignore"))  temp_box.ignore  = sa = atts["ignore"];
                        if (atts.is_in_list("angle"))  temp_box.angle  = sa = atts["angle"];
                        if (atts.is_in_list("age"))  temp_box.age  = sa = atts["age"];
                        if (atts.is_in_list("gender"))  
                        {
                            if (atts["gender"] == "male")
                                temp_box.gender = MALE;
                            else if (atts["gender"] == "female")
                                temp_box.gender = FEMALE;
                            else if (atts["gender"] == "unknown")
                                temp_box.gender = UNKNOWN;
                            else
                                throw dlib::error("Invalid gender string in box attribute.");
                        }
                        if (atts.is_in_list("pose"))  temp_box.pose  = sa = atts["pose"];
                        if (atts.is_in_list("detection_score"))  temp_box.detection_score  = sa = atts["detection_score"];

                        temp_box.rect.bottom() += temp_box.rect.top()-1;
                        temp_box.rect.right() += temp_box.rect.left()-1;
                    }
                    else if (name == "part" && ts.back() == "box")
                    {
                        point temp;
                        if (atts.is_in_list("x")) temp.x() = sa = atts["x"];
                        else throw dlib::error("<part> missing required attribute 'x'");

                        if (atts.is_in_list("y")) temp.y() = sa = atts["y"];
                        else throw dlib::error("<part> missing required attribute 'y'");

                        if (atts.is_in_list("name")) 
                        {
                            if (temp_box.parts.count(atts["name"])==0)
                            {
                                temp_box.parts[atts["name"]] = temp;
                            }
                            else
                            {
                                throw dlib::error("<part> with name '" + atts["name"] + "' is defined more than one time in a single box.");
                            }
                        }
                        else 
                        {
                            throw dlib::error("<part> missing required attribute 'name'");
                        }
                    }
                    else if (name == "image")
                    {
                        temp_image.boxes.clear();

                        if (atts.is_in_list("file")) temp_image.filename = atts["file"];
                        else throw dlib::error("<image> missing required attribute 'file'");
                    }

                    ts.push_back(name);
                }
                catch (error& e)
                {
                    throw dlib::error("Error on line " + cast_to_string(line_number) + ": " + e.what());
                }
            }